

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgLoadNeededValues.hpp
# Opt level: O1

void TasGrid::loadNeededValues<true,true>
               (function<void_(const_double_*,_double_*,_unsigned_long)> *model,
               TasmanianSparseGrid *grid,size_t num_threads)

{
  BaseCanonicalGrid *pBVar1;
  pointer ptVar2;
  pointer ptVar3;
  runtime_error *this;
  int iVar4;
  thread *w;
  size_t sVar5;
  long lVar6;
  size_t thread_id;
  int num_points;
  vector<bool,_std::allocator<bool>_> checked_out;
  Wrapper2D<double> ywrap;
  Wrapper2D<double> xwrap;
  vector<double,_std::allocator<double>_> values;
  vector<std::thread,_std::allocator<std::thread>_> workers;
  vector<double,_std::allocator<double>_> points;
  mutex checked_out_lock;
  int local_13c;
  size_t local_138;
  vector<bool,_std::allocator<bool>_> local_130;
  function<void_(const_double_*,_double_*,_unsigned_long)> *local_108;
  Wrapper2D<double> local_100;
  Wrapper2D<double> local_f0;
  vector<double,_std::allocator<double>_> local_e0;
  vector<std::thread,_std::allocator<std::thread>_> local_c8;
  TasmanianSparseGrid *local_b0;
  vector<double,_std::allocator<double>_> local_a8;
  anon_class_56_7_dc8e8c63_for__M_head_impl local_90;
  __native_type local_58;
  
  pBVar1 = (grid->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  iVar4 = 0;
  local_13c = 0;
  if ((pBVar1 != (BaseCanonicalGrid *)0x0) && (local_13c = *(int *)(pBVar1 + 0x14), local_13c != 0))
  {
    local_13c = *(int *)(pBVar1 + 0x20);
  }
  if (pBVar1 != (BaseCanonicalGrid *)0x0) {
    iVar4 = *(int *)(pBVar1 + 0x14);
  }
  local_138 = num_threads;
  local_108 = model;
  if (grid->using_dynamic_construction == true) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,"ERROR: cannot call loadNeededPoints() addon when isUsingConstruction() is true"
              );
  }
  else {
    if (iVar4 != 0) {
      if (local_13c != 0) {
        if ((pBVar1 != (BaseCanonicalGrid *)0x0) && (*(int *)(pBVar1 + 0x48) != 0)) {
          TasGrid::TasmanianSparseGrid::clearRefinement();
        }
        TasmanianSparseGrid::getLoadedPoints(&local_a8,grid);
        sVar5 = (size_t)iVar4;
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_e0,(long)local_13c * sVar5,(allocator_type *)&local_90);
        pBVar1 = (grid->base)._M_t.
                 super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                 .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
        if (pBVar1 == (BaseCanonicalGrid *)0x0) {
          local_f0.stride = 0;
        }
        else {
          local_f0.stride = (size_t)*(int *)(pBVar1 + 0x10);
        }
        local_f0.data =
             local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_100.data =
             local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_100.stride = sVar5;
        if (local_138 == 0) {
          if (0 < local_13c) {
            lVar6 = 0;
            do {
              std::function<void_(const_double_*,_double_*,_unsigned_long)>::operator()
                        (local_108,local_f0.data + local_f0.stride * lVar6,
                         local_100.data + local_100.stride * lVar6,0);
              lVar6 = lVar6 + 1;
            } while (lVar6 < local_13c);
          }
        }
        else {
          local_90.thread_id = local_90.thread_id & 0xffffffffffffff00;
          std::vector<bool,_std::allocator<bool>_>::vector
                    (&local_130,(long)local_13c,(bool *)&local_90,(allocator_type *)&local_58.__data
                    );
          local_58.__data.__list.__next = (__pthread_internal_list *)0x0;
          local_58._16_8_ = 0;
          local_58.__data.__list.__prev = (__pthread_internal_list *)0x0;
          local_58.__align = 0;
          local_58._8_8_ = 0;
          local_c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_b0 = grid;
          std::vector<std::thread,_std::allocator<std::thread>_>::reserve(&local_c8,local_138);
          sVar5 = 0;
          do {
            local_90.checked_out_lock = (mutex *)&local_58;
            local_90.checked_out = &local_130;
            local_90.model = local_108;
            local_90.thread_id = sVar5;
            local_90.num_points = &local_13c;
            local_90.xwrap = &local_f0;
            local_90.ywrap = &local_100;
            std::vector<std::thread,std::allocator<std::thread>>::
            emplace_back<TasGrid::loadNeededValues<true,true>(std::function<void(double_const*,double*,unsigned_long)>,TasGrid::TasmanianSparseGrid&,unsigned_long)::_lambda()_1_>
                      ((vector<std::thread,std::allocator<std::thread>> *)&local_c8,&local_90);
            grid = local_b0;
            ptVar3 = local_c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            sVar5 = sVar5 + 1;
            ptVar2 = local_c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_start;
          } while (local_138 != sVar5);
          for (; ptVar2 != ptVar3; ptVar2 = ptVar2 + 1) {
            std::thread::join();
          }
          std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_c8);
          if (local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_end_of_storage -
                            (long)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_offset = 0;
            local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset = 0;
            local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage = (_Bit_pointer)0x0;
          }
        }
        TasGrid::TasmanianSparseGrid::loadNeededValues((vector *)grid);
        if (local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_e0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
      }
      return;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,"ERROR: cannot call loadNeededPoints() addon when the grid has no outputs");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void loadNeededValues(std::function<void(double const x[], double y[], size_t thread_id)> model, TasmanianSparseGrid &grid, size_t num_threads){
    int num_points = (overwrite_loaded) ? grid.getNumLoaded() : grid.getNumNeeded();
    int num_outputs = grid.getNumOutputs();
    if (grid.isUsingConstruction()) throw std::runtime_error("ERROR: cannot call loadNeededPoints() addon when isUsingConstruction() is true");
    if (num_outputs == 0) throw std::runtime_error("ERROR: cannot call loadNeededPoints() addon when the grid has no outputs");
    if (num_points == 0) return; // nothing to do here
    if (overwrite_loaded && (grid.getNumNeeded() != 0)) grid.clearRefinement(); // using loaded points only, clear the refinement

    // get the points and values
    auto points = (overwrite_loaded) ? grid.getLoadedPoints() : grid.getNeededPoints();
    std::vector<double> values(Utils::size_mult(num_points, num_outputs));

    // divide logically into strips
    Utils::Wrapper2D<double> xwrap(grid.getNumDimensions(), points.data());
    Utils::Wrapper2D<double> ywrap(num_outputs, values.data());

    if (parallel_construction && (num_threads > 0)){
        std::vector<bool> checked_out(num_points, false);
        std::mutex checked_out_lock;

        std::vector<std::thread> workers;
        workers.reserve(num_threads);
        for(size_t thread_id=0; thread_id<num_threads; thread_id++){
            workers.emplace_back( // create a new worker thread
                [&, thread_id](void)->void{
                    int sample = 0;
                    do{
                        { // find the next sample
                            std::lock_guard<std::mutex> lock(checked_out_lock);
                            while ((sample < num_points) && checked_out[sample]) sample++;
                            if (sample < num_points) checked_out[sample] = true;
                        }
                        if (sample < num_points) // if found, compute the next sample
                            model(xwrap.getStrip(sample), ywrap.getStrip(sample), thread_id);
                    }while(sample < num_points);
                }
            );
        }

        for(auto &w : workers) w.join(); // wait till finished

    }else{
        for(int i=0; i<num_points; i++)
            model(xwrap.getStrip(i), ywrap.getStrip(i), 0);
    }

    grid.loadNeededPoints(values);
}